

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall opengv::absolute_pose::modules::Epnp::Epnp(Epnp *this)

{
  Epnp *this_local;
  
  this->maximum_number_of_correspondences = 0;
  this->number_of_correspondences = 0;
  this->pws = (double *)0x0;
  this->us = (double *)0x0;
  this->alphas = (double *)0x0;
  this->pcs = (double *)0x0;
  this->signs = (int *)0x0;
  this->uc = 0.0;
  this->vc = 0.0;
  this->fu = 1.0;
  this->fv = 1.0;
  return;
}

Assistant:

opengv::absolute_pose::modules::Epnp::Epnp(void)
{
  maximum_number_of_correspondences = 0;
  number_of_correspondences = 0;

  pws = 0;
  us = 0;
  alphas = 0;
  pcs = 0;
  signs = 0; //added

  this->uc = 0.0;
  this->vc = 0.0;
  this->fu = 1.0;
  this->fv = 1.0;
}